

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfCloseMesh(int64_t MshIdx)

{
  void *in_RDI;
  GmfMshSct *msh;
  int res;
  int i;
  void *__ptr;
  int iVar1;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  iVar1 = 1;
  __ptr = in_RDI;
  RecBlk((GmfMshSct *)CONCAT44(in_stack_fffffffffffffff4,1),in_RDI,0);
  if (*(int *)((long)__ptr + 8) == 2) {
    if ((*(uint *)((long)__ptr + 0xc) & 1) == 0) {
      GmfSetKwd((int64_t)in_RDI,0x36,0);
    }
    else {
      fprintf(*(FILE **)((long)__ptr + 0x300410),"\n%s\n",GmfKwdFmt[0x36][0]);
    }
  }
  if ((*(uint *)((long)__ptr + 0xc) & 2) == 0) {
    iVar2 = fclose(*(FILE **)((long)__ptr + 0x300410));
    if (iVar2 != 0) {
      iVar1 = 0;
    }
  }
  else {
    fclose(*(FILE **)((long)__ptr + 0x300410));
  }
  for (iVar2 = 0; iVar2 < 0xf1; iVar2 = iVar2 + 1) {
    if (*(long *)((long)__ptr + (long)iVar2 * 0x3300 + 0x10c8) != 0) {
      free(*(void **)((long)__ptr + (long)iVar2 * 0x3300 + 0x10c8));
    }
  }
  free(__ptr);
  return iVar1;
}

Assistant:

int GmfCloseMesh(int64_t MshIdx)
{
   int i, res = 1;
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   RecBlk(msh, msh->buf, 0);

   // In write down the "End" kw in write mode
   if(msh->mod == GmfWrite)
   {
      if(msh->typ & Asc)
         fprintf(msh->hdl, "\n%s\n", GmfKwdFmt[ GmfEnd ][0]);
      else
         GmfSetKwd(MshIdx, GmfEnd, 0);
   }

   // Close the file and free the mesh structure
   if(msh->typ & Bin)
#ifdef WITH_GMF_AIO
      close(msh->FilDes);
#else
      fclose(msh->hdl);
#endif
   else if(fclose(msh->hdl))
      res = 0;

   // Free optional H.O. renumbering tables
   for(i=0;i<GmfLastKeyword;i++)
      if(msh->KwdTab[i].OrdTab)
         free(msh->KwdTab[i].OrdTab);

   free(msh);

   return(res);
}